

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int batchSize;
  Configuration CVar1;
  clock_t cVar2;
  clock_t cVar3;
  ostream *poVar4;
  int argc_offset;
  PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
  reader;
  SquareSolverService service;
  
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 100;
  CVar1 = ParseCmdArgs(argc,argv,&argc_offset);
  cVar2 = clock();
  if (((uint)CVar1 >> 0x18 & 1) == 0) {
    PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
    ::PolynomeReader(&reader,argc - argc_offset,argv + argc_offset);
    batchSize = 0x20;
  }
  else {
    PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
    ::PolynomeReader(&reader,(istream *)&std::cin);
    batchSize = 1;
  }
  SquareSolverService::SquareSolverService(&service,&reader,(bool)(CVar1.silent & 1),batchSize);
  SquareSolverService::Run(&service);
  cVar3 = clock();
  if (((uint)CVar1 >> 0x10 & 1) != 0) {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 6;
    std::operator<<((ostream *)&std::cout,"request processing time: ");
    poVar4 = std::ostream::_M_insert<double>((double)(cVar3 - cVar2) / 1000000.0);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  SquareSolverService::~SquareSolverService(&service);
  PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
  ::~PolynomeReader(&reader);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    std::cout.precision(std::numeric_limits<FloatType>::digits10);
    
    //argc_offset is used to make clear from which point of arguments interesting data is placed
    int argc_offset;
    const Configuration config = ParseCmdArgs(argc, argv, argc_offset);
    
    clock_t requestStartTime = clock();
    
    //interactive mode allows to type coeffs in console in real time
    PolynomeReader<FloatType, 3> reader = config.interactive ? PolynomeReader<FloatType, 3>(std::cin) : PolynomeReader<FloatType, 3>(argc - argc_offset, argv + argc_offset);
    SquareSolverService service(reader, config.silent, config.interactive ? 1 : 32);
    service.Run();
    
    clock_t requestEndTime = clock();

    if (config.measurePerformance) {
        std::cout.precision(6);
        std::cout << "request processing time: " << (requestEndTime - requestStartTime) / double(CLOCKS_PER_SEC) << std::endl;
    }
        
    return 0;
}